

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<Header>::emplace<Header>
          (QGenericArrayOps<Header> *this,qsizetype i,Header *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<Header> *in_RSI;
  QArrayDataPointer<Header> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Header tmp;
  Header *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff54;
  byte bVar6;
  GrowthPosition where;
  Inserter local_90;
  undefined1 local_40 [56];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<Header>::needsDetach
                    ((QArrayDataPointer<Header> *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<Header> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<Header>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<Header>::end
                ((QArrayDataPointer<Header> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      Header::Header((Header *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_001da2c2;
    }
    if ((in_RSI == (QArrayDataPointer<Header> *)0x0) &&
       (qVar3 = QArrayDataPointer<Header>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<Header>::begin((QArrayDataPointer<Header> *)0x1da18a);
      Header::Header((Header *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_001da2c2;
    }
  }
  memset(local_40,0xaa,0x38);
  Header::Header((Header *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<Header> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<Header> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<Header>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff54,uVar2))),
             (Header **)in_RDI,
             (QArrayDataPointer<Header> *)CONCAT17(uVar5,in_stack_ffffffffffffff40));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_90,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff54,uVar2))),
                        (qsizetype)in_RDI,(Header *)CONCAT17(uVar5,in_stack_ffffffffffffff40));
    Inserter::~Inserter(&local_90);
  }
  else {
    QArrayDataPointer<Header>::begin((QArrayDataPointer<Header> *)0x1da252);
    Header::Header((Header *)CONCAT17(uVar5,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  Header::~Header((Header *)CONCAT17(uVar5,in_stack_ffffffffffffff40));
LAB_001da2c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }